

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFPageObjectHelper::externalizeInlineImages
          (QPDFPageObjectHelper *this,size_t min_size,bool shallow)

{
  BaseHandle *pBVar1;
  string *psVar2;
  bool bVar3;
  QPDF *pQVar4;
  undefined7 in_register_00000011;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  QPDFObjectHandle local_1d8;
  string local_1c8;
  string local_1a8;
  string local_188;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_168;
  QPDFObjectHandle resources;
  undefined1 local_148 [16];
  undefined1 local_138 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  Pl_Buffer b;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_e0;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  InlineImageTracker iit;
  
  if ((int)CONCAT71(in_register_00000011,shallow) == 0) {
    externalizeInlineImages(this,min_size,true);
    local_d0._8_8_ = 0;
    local_b8 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:436:19)>
               ::_M_invoke;
    local_c0 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:436:19)>
               ::_M_manager;
    local_d0._M_unused._M_member_pointer = min_size;
    forEachFormXObject(this,true,
                       (function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_d0);
    std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iit,"/Resources",(allocator<char> *)&b);
    getAttribute((QPDFPageObjectHelper *)&resources,(string *)this,SUB81(&iit,0));
    std::__cxx11::string::~string((string *)&iit);
    operator____qpdf(local_138 + 0x10,0x21635b);
    QPDFObjectHandle::mergeResources
              (&resources,(QPDFObjectHandle *)(local_138 + 0x10),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                *)0x0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
    pBVar1 = &(this->super_QPDFObjectHelper).super_BaseHandle;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&b,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    pQVar4 = QPDFObjectHandle::getOwningQPDF((QPDFObjectHandle *)&b);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&resources);
    iit.super_TokenFilter._vptr_TokenFilter = (_func_int **)&PTR__InlineImageTracker_002afef8;
    iit.qpdf = pQVar4;
    iit.min_size = min_size;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&iit.resources,&local_e0);
    iit.dict_str._M_dataplus._M_p = (pointer)&iit.dict_str.field_2;
    iit.dict_str._M_string_length = 0;
    iit.dict_str.field_2._M_local_buf[0] = '\0';
    iit.bi_str._M_dataplus._M_p = (pointer)&iit.bi_str.field_2;
    iit.bi_str._M_string_length = 0;
    iit.bi_str.field_2._M_local_buf[0] = '\0';
    iit.min_suffix = 1;
    iit.any_images = false;
    iit.state = st_top;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b.super_Pipeline.identifier);
    Pl_Buffer::Pl_Buffer(&b,"new page content",(Pipeline *)0x0);
    filterContents(this,&iit.super_TokenFilter,&b.super_Pipeline);
    if (iit.any_images == true) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_1c8,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
      bVar3 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&local_1c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8._M_string_length);
      if (bVar3) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_1c8,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
        Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)local_138);
        QPDFObjectHandle::newNull();
        QPDFObjectHandle::newNull();
        QPDFObjectHandle::replaceStreamData
                  ((QPDFObjectHandle *)&local_1c8,(shared_ptr<Buffer> *)local_138,
                   (QPDFObjectHandle *)&local_188,(QPDFObjectHandle *)&local_1a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1a8._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_188._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
        psVar2 = &local_1c8;
      }
      else {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_1a8,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"/Contents",&local_1d9);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_168,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"",&local_1da);
        pQVar4 = QPDFObjectHandle::getQPDF((QPDFObjectHandle *)&local_168,&local_188);
        Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)local_148);
        QPDFObjectHandle::newStream(&local_1d8,pQVar4,(shared_ptr<Buffer> *)local_148);
        QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_1a8,&local_1c8,&local_1d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1d8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
        std::__cxx11::string::~string((string *)&local_188);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
        std::__cxx11::string::~string((string *)&local_1c8);
        psVar2 = &local_1a8;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar2->_M_string_length);
    }
    Pl_Buffer::~Pl_Buffer(&b);
    anon_unknown.dwarf_4bfc3f::InlineImageTracker::~InlineImageTracker(&iit);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&resources.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void
QPDFPageObjectHelper::externalizeInlineImages(size_t min_size, bool shallow)
{
    if (shallow) {
        QPDFObjectHandle resources = getAttribute("/Resources", true);
        // Calling mergeResources also ensures that /XObject becomes direct and is not shared with
        // other pages.
        resources.mergeResources("<< /XObject << >> >>"_qpdf);
        InlineImageTracker iit(oh().getOwningQPDF(), min_size, resources);
        Pl_Buffer b("new page content");
        bool filtered = false;
        try {
            filterContents(&iit, &b);
            filtered = true;
        } catch (std::exception& e) {
            oh().warnIfPossible(
                std::string("Unable to filter content stream: ") + e.what() +
                "; not attempting to externalize inline images from this stream");
        }
        if (filtered && iit.any_images) {
            if (oh().isFormXObject()) {
                oh().replaceStreamData(
                    b.getBufferSharedPointer(),
                    QPDFObjectHandle::newNull(),
                    QPDFObjectHandle::newNull());
            } else {
                oh().replaceKey(
                    "/Contents",
                    QPDFObjectHandle::newStream(&oh().getQPDF(), b.getBufferSharedPointer()));
            }
        }
    } else {
        externalizeInlineImages(min_size, true);
        forEachFormXObject(
            true, [min_size](QPDFObjectHandle& obj, QPDFObjectHandle&, std::string const&) {
                QPDFPageObjectHelper(obj).externalizeInlineImages(min_size, true);
            });
    }
}